

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>
               (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *first,
               left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *last,
               left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *x)

{
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *plVar1;
  
  src = (EVP_PKEY_CTX *)(((long)last - (long)first) % 0x18);
  plVar1 = first;
  switch((uint)(((long)last - (long)first) / 0x18) & 7) {
  case 0:
    while (plVar1 != last) {
      first = plVar1 + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (plVar1,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX;
switchD_00168737_caseD_7:
      plVar1 = first + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (first,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_00;
switchD_00168737_caseD_6:
      first = plVar1 + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (plVar1,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_01;
switchD_00168737_caseD_5:
      plVar1 = first + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (first,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_02;
switchD_00168737_caseD_4:
      first = plVar1 + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (plVar1,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_03;
switchD_00168737_caseD_3:
      plVar1 = first + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (first,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_04;
switchD_00168737_caseD_2:
      first = plVar1 + 1;
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (plVar1,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_05;
switchD_00168737_caseD_1:
      left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
                (first,(EVP_PKEY_CTX *)x,src);
      src = extraout_RDX_06;
      plVar1 = first + 1;
    }
    break;
  case 1:
    goto switchD_00168737_caseD_1;
  case 2:
    goto switchD_00168737_caseD_2;
  case 3:
    goto switchD_00168737_caseD_3;
  case 4:
    goto switchD_00168737_caseD_4;
  case 5:
    goto switchD_00168737_caseD_5;
  case 6:
    goto switchD_00168737_caseD_6;
  case 7:
    goto switchD_00168737_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}